

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  float fVar2;
  float fVar3;
  size_t sVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  undefined1 auVar7 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  bool bVar16;
  uint uVar17;
  undefined4 uVar18;
  int iVar19;
  long lVar20;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar21;
  size_t sVar22;
  size_t sVar23;
  uint uVar24;
  NodeRef *pNVar25;
  NodeRef root;
  long lVar26;
  long lVar27;
  ulong uVar28;
  vint4 ai_2;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 in_ZMM0 [64];
  float fVar36;
  float fVar42;
  float fVar43;
  vint4 ai;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar44;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  vint4 bi_3;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  vint4 bi_2;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  vint4 bi_1;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  vint4 ai_1;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  vint4 ai_3;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  vint4 bi;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [64];
  uint uVar75;
  uint uVar79;
  uint uVar80;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  uint uVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  vbool<4> terminated;
  undefined1 local_19c8 [16];
  undefined1 local_19a8 [16];
  BVH *local_1998;
  Intersectors *local_1990;
  long local_1988;
  long local_1980;
  undefined1 local_1978 [16];
  undefined1 local_1968 [16];
  undefined1 local_1958 [16];
  undefined1 local_1948 [16];
  undefined1 local_1938 [16];
  undefined1 local_1928 [8];
  float fStack_1920;
  float fStack_191c;
  undefined1 local_1918 [8];
  float fStack_1910;
  float fStack_190c;
  undefined1 local_1908 [8];
  float fStack_1900;
  float fStack_18fc;
  undefined1 local_18f8 [16];
  int local_18e8;
  int iStack_18e4;
  int iStack_18e0;
  int iStack_18dc;
  vfloat<4> t;
  vfloat<4> v;
  vfloat<4> u;
  TravRayK<4,_false> tray;
  anon_union_48_2_4062524c_for_Vec3<embree::vfloat_impl<4>_>_1 local_1798;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined1 local_1758 [8];
  float fStack_1750;
  float fStack_174c;
  float local_1748;
  float fStack_1744;
  float fStack_1740;
  float fStack_173c;
  undefined1 local_1738 [16];
  uint local_1728;
  uint uStack_1724;
  uint uStack_1720;
  uint uStack_171c;
  uint uStack_1718;
  uint uStack_1714;
  uint uStack_1710;
  uint uStack_170c;
  Vec3vf<4> Ng;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar15 = mm_lookupmask_ps._8_8_;
  uVar14 = mm_lookupmask_ps._0_8_;
  local_1998 = (BVH *)This->ptr;
  stack_node[1].ptr = (local_1998->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar39 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar54 = vpcmpeqd_avx(auVar39,(undefined1  [16])valid_i->field_0);
    auVar38 = ZEXT816(0) << 0x40;
    auVar51 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar38,5);
    auVar34 = auVar54 & auVar51;
    if ((((auVar34 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar34 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar34 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar34[0xf] < '\0')
    {
      local_18f8 = vandps_avx(auVar51,auVar54);
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      local_1978._8_4_ = 0x7fffffff;
      local_1978._0_8_ = 0x7fffffff7fffffff;
      local_1978._12_4_ = 0x7fffffff;
      auVar51 = vandps_avx(local_1978,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar70._8_4_ = 0x219392ef;
      auVar70._0_8_ = 0x219392ef219392ef;
      auVar70._12_4_ = 0x219392ef;
      auVar51 = vcmpps_avx(auVar51,auVar70,1);
      auVar54 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar70,auVar51);
      auVar51 = vandps_avx(local_1978,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar51 = vcmpps_avx(auVar51,auVar70,1);
      auVar34 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar70,auVar51);
      auVar51 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,local_1978);
      auVar51 = vcmpps_avx(auVar51,auVar70,1);
      auVar51 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar70,auVar51);
      auVar57 = vrcpps_avx(auVar54);
      auVar71._8_4_ = 0x3f800000;
      auVar71._0_8_ = 0x3f8000003f800000;
      auVar71._12_4_ = 0x3f800000;
      auVar54 = vfnmadd213ps_fma(auVar54,auVar57,auVar71);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar54,auVar57,auVar57)
      ;
      auVar54 = vrcpps_avx(auVar34);
      auVar34 = vfnmadd213ps_fma(auVar34,auVar54,auVar71);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar34,auVar54,auVar54)
      ;
      auVar54 = vrcpps_avx(auVar51);
      auVar51 = vfnmadd213ps_fma(auVar51,auVar54,auVar71);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar51,auVar54,auVar54)
      ;
      tray.org_rdir.field_0._0_4_ = tray.rdir.field_0._0_4_ * (float)tray.org.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = tray.rdir.field_0._4_4_ * (float)tray.org.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = tray.rdir.field_0._8_4_ * (float)tray.org.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = tray.rdir.field_0._12_4_ * (float)tray.org.field_0._12_4_;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      auVar51 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar38,1);
      auVar54._8_4_ = 0x10;
      auVar54._0_8_ = 0x1000000010;
      auVar54._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar51,auVar54);
      auVar51 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar38,5);
      auVar34._8_4_ = 0x20;
      auVar34._0_8_ = 0x2000000020;
      auVar34._12_4_ = 0x20;
      auVar57._8_4_ = 0x30;
      auVar57._0_8_ = 0x3000000030;
      auVar57._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar57,auVar34,auVar51);
      auVar51 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar38,5);
      auVar58._8_4_ = 0x40;
      auVar58._0_8_ = 0x4000000040;
      auVar58._12_4_ = 0x40;
      auVar62._8_4_ = 0x50;
      auVar62._0_8_ = 0x5000000050;
      auVar62._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar62,auVar58,auVar51);
      auVar51 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar38);
      auVar54 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar38);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar74 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar51,local_18f8);
      auVar41 = ZEXT1664((undefined1  [16])tray.tnear.field_0);
      auVar51._8_4_ = 0xff800000;
      auVar51._0_8_ = 0xff800000ff800000;
      auVar51._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar51,auVar54,local_18f8);
      terminated.field_0.i[1] = local_18f8._4_4_ ^ auVar39._4_4_;
      terminated.field_0.i[0] = local_18f8._0_4_ ^ auVar39._0_4_;
      terminated.field_0.i[2] = local_18f8._8_4_ ^ auVar39._8_4_;
      terminated.field_0.i[3] = local_18f8._12_4_ ^ auVar39._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar24 = 3;
      }
      else {
        uVar24 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar25 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar21 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      local_1990 = This;
LAB_0153fbe1:
      do {
        do {
          root.ptr = pNVar25[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_015405d5;
          pNVar25 = pNVar25 + -1;
          paVar21 = paVar21 + -1;
          aVar76 = *paVar21;
          auVar51 = vcmpps_avx((undefined1  [16])aVar76,(undefined1  [16])tray.tfar.field_0,1);
          uVar17 = vmovmskps_avx(auVar51);
        } while (uVar17 == 0);
        uVar28 = (ulong)(uVar17 & 0xff);
        uVar17 = POPCOUNT(uVar17 & 0xff);
        if (uVar24 < uVar17) {
LAB_0153fc21:
          iVar19 = 4;
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_015405d5;
              auVar51 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar76,6);
              if ((((auVar51 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar51 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar51 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar51[0xf]) goto LAB_0153fbe1;
              local_1988 = (ulong)((uint)root.ptr & 0xf) - 8;
              local_18e8 = terminated.field_0.i[0];
              iStack_18e4 = terminated.field_0.i[1];
              iStack_18e0 = terminated.field_0.i[2];
              iStack_18dc = terminated.field_0.i[3];
              local_19c8._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
              local_19c8._8_4_ = terminated.field_0.i[2] ^ 0xffffffff;
              local_19c8._12_4_ = terminated.field_0.i[3] ^ 0xffffffff;
              lVar26 = (root.ptr & 0xfffffffffffffff0) + 0xa0;
              lVar20 = 0;
              goto LAB_0153fe23;
            }
            sVar23 = 8;
            aVar76 = auVar74._0_16_;
            for (lVar20 = 0;
                (lVar20 != 4 &&
                (sVar4 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar20 * 8), sVar4 != 8));
                lVar20 = lVar20 + 1) {
              uVar18 = *(undefined4 *)(root.ptr + 0x20 + lVar20 * 4);
              auVar37._4_4_ = uVar18;
              auVar37._0_4_ = uVar18;
              auVar37._8_4_ = uVar18;
              auVar37._12_4_ = uVar18;
              auVar11._4_4_ = tray.org_rdir.field_0._4_4_;
              auVar11._0_4_ = tray.org_rdir.field_0._0_4_;
              auVar11._8_4_ = tray.org_rdir.field_0._8_4_;
              auVar11._12_4_ = tray.org_rdir.field_0._12_4_;
              auVar54 = vfmsub213ps_fma(auVar37,(undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0,auVar11);
              uVar18 = *(undefined4 *)(root.ptr + 0x40 + lVar20 * 4);
              auVar59._4_4_ = uVar18;
              auVar59._0_4_ = uVar18;
              auVar59._8_4_ = uVar18;
              auVar59._12_4_ = uVar18;
              auVar12._4_4_ = tray.org_rdir.field_0._20_4_;
              auVar12._0_4_ = tray.org_rdir.field_0._16_4_;
              auVar12._8_4_ = tray.org_rdir.field_0._24_4_;
              auVar12._12_4_ = tray.org_rdir.field_0._28_4_;
              auVar34 = vfmsub213ps_fma(auVar59,(undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0,auVar12);
              uVar18 = *(undefined4 *)(root.ptr + 0x60 + lVar20 * 4);
              auVar64._4_4_ = uVar18;
              auVar64._0_4_ = uVar18;
              auVar64._8_4_ = uVar18;
              auVar64._12_4_ = uVar18;
              auVar13._4_4_ = tray.org_rdir.field_0._36_4_;
              auVar13._0_4_ = tray.org_rdir.field_0._32_4_;
              auVar13._8_4_ = tray.org_rdir.field_0._40_4_;
              auVar13._12_4_ = tray.org_rdir.field_0._44_4_;
              auVar38 = vfmsub213ps_fma(auVar64,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,auVar13);
              uVar18 = *(undefined4 *)(root.ptr + 0x30 + lVar20 * 4);
              auVar68._4_4_ = uVar18;
              auVar68._0_4_ = uVar18;
              auVar68._8_4_ = uVar18;
              auVar68._12_4_ = uVar18;
              auVar57 = vfmsub213ps_fma(auVar68,(undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0,auVar11);
              uVar18 = *(undefined4 *)(root.ptr + 0x50 + lVar20 * 4);
              auVar55._4_4_ = uVar18;
              auVar55._0_4_ = uVar18;
              auVar55._8_4_ = uVar18;
              auVar55._12_4_ = uVar18;
              auVar58 = vfmsub213ps_fma(auVar55,(undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0,auVar12);
              uVar18 = *(undefined4 *)(root.ptr + 0x70 + lVar20 * 4);
              auVar45._4_4_ = uVar18;
              auVar45._0_4_ = uVar18;
              auVar45._8_4_ = uVar18;
              auVar45._12_4_ = uVar18;
              auVar62 = vfmsub213ps_fma(auVar45,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,auVar13);
              auVar51 = vpminsd_avx(auVar54,auVar57);
              auVar39 = vpminsd_avx(auVar34,auVar58);
              auVar51 = vpmaxsd_avx(auVar51,auVar39);
              auVar39 = vpminsd_avx(auVar38,auVar62);
              auVar39 = vpmaxsd_avx(auVar51,auVar39);
              auVar51 = vpmaxsd_avx(auVar54,auVar57);
              auVar54 = vpmaxsd_avx(auVar34,auVar58);
              auVar54 = vpminsd_avx(auVar51,auVar54);
              auVar51 = vpmaxsd_avx(auVar38,auVar62);
              auVar54 = vpminsd_avx(auVar54,auVar51);
              auVar51 = vpmaxsd_avx(auVar39,(undefined1  [16])tray.tnear.field_0);
              auVar54 = vpminsd_avx(auVar54,(undefined1  [16])tray.tfar.field_0);
              auVar51 = vcmpps_avx(auVar51,auVar54,2);
              auVar41 = ZEXT1664(auVar51);
              sVar22 = sVar23;
              aVar8 = aVar76;
              if (((((auVar51 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar51 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar51 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   auVar51[0xf] < '\0') &&
                 (aVar8.v = (__m128)vblendvps_avx(auVar74._0_16_,auVar39,auVar51), sVar22 = sVar4,
                 sVar23 != 8)) {
                pNVar25->ptr = sVar23;
                pNVar25 = pNVar25 + 1;
                *paVar21 = aVar76;
                paVar21 = paVar21 + 1;
              }
              aVar76 = aVar8;
              sVar23 = sVar22;
            }
            if (sVar23 == 8) goto LAB_0153fd99;
            auVar51 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar76,6);
            uVar18 = vmovmskps_avx(auVar51);
            root.ptr = sVar23;
          } while ((byte)uVar24 < (byte)POPCOUNT(uVar18));
          pNVar25->ptr = sVar23;
          pNVar25 = pNVar25 + 1;
          *paVar21 = aVar76;
          paVar21 = paVar21 + 1;
        }
        else {
          while (uVar28 != 0) {
            sVar23 = 0;
            for (uVar9 = uVar28; (uVar9 & 1) == 0; uVar9 = uVar9 >> 1 | 0x8000000000000000) {
              sVar23 = sVar23 + 1;
            }
            uVar28 = uVar28 - 1 & uVar28;
            auVar41 = ZEXT1664(auVar41._0_16_);
            bVar16 = occluded1(local_1990,local_1998,root,sVar23,&pre,ray,&tray,context);
            if (bVar16) {
              terminated.field_0.i[sVar23] = -1;
            }
          }
          auVar51 = _DAT_01f46b70 & ~(undefined1  [16])terminated.field_0;
          iVar19 = 3;
          auVar74 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          if ((((auVar51 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar51 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar51 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar51[0xf] < '\0') {
            auVar41 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
            auVar39._8_4_ = 0xff800000;
            auVar39._0_8_ = 0xff800000ff800000;
            auVar39._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar39,
                               (undefined1  [16])terminated.field_0);
            iVar19 = 2;
          }
          if (uVar24 < uVar17) goto LAB_0153fc21;
        }
LAB_0153fd99:
      } while ((iVar19 == 4) || (iVar19 == 2));
LAB_015405d5:
      auVar51 = vandps_avx(local_18f8,(undefined1  [16])terminated.field_0);
      auVar40._8_4_ = 0xff800000;
      auVar40._0_8_ = 0xff800000ff800000;
      auVar40._12_4_ = 0xff800000;
      auVar51 = vmaskmovps_avx(auVar51,auVar40);
      *(undefined1 (*) [16])pRVar1 = auVar51;
    }
  }
  return;
LAB_0153fe23:
  do {
    lVar27 = -0x10;
    auVar39 = auVar41._0_16_;
    auVar51 = local_19c8;
    if (lVar20 == local_1988) break;
    do {
      local_1980 = lVar20;
      if (lVar27 == 0) break;
      uVar17 = *(uint *)(lVar26 + lVar27);
      if ((ulong)uVar17 == 0xffffffff) break;
      uVar18 = *(undefined4 *)(lVar26 + -0x90 + lVar27);
      auVar52._4_4_ = uVar18;
      auVar52._0_4_ = uVar18;
      auVar52._8_4_ = uVar18;
      auVar52._12_4_ = uVar18;
      uVar18 = *(undefined4 *)(lVar26 + -0x80 + lVar27);
      auVar60._4_4_ = uVar18;
      auVar60._0_4_ = uVar18;
      auVar60._8_4_ = uVar18;
      auVar60._12_4_ = uVar18;
      uVar18 = *(undefined4 *)(lVar26 + -0x70 + lVar27);
      auVar65._4_4_ = uVar18;
      auVar65._0_4_ = uVar18;
      auVar65._8_4_ = uVar18;
      auVar65._12_4_ = uVar18;
      fVar36 = *(float *)(lVar26 + -0x60 + lVar27);
      auVar46._4_4_ = fVar36;
      auVar46._0_4_ = fVar36;
      auVar46._8_4_ = fVar36;
      auVar46._12_4_ = fVar36;
      fVar42 = *(float *)(lVar26 + -0x50 + lVar27);
      auVar69._4_4_ = fVar42;
      auVar69._0_4_ = fVar42;
      auVar69._8_4_ = fVar42;
      auVar69._12_4_ = fVar42;
      fVar43 = *(float *)(lVar26 + -0x40 + lVar27);
      auVar67._4_4_ = fVar43;
      auVar67._0_4_ = fVar43;
      auVar67._8_4_ = fVar43;
      auVar67._12_4_ = fVar43;
      fVar44 = *(float *)(lVar26 + -0x30 + lVar27);
      auVar72._4_4_ = fVar44;
      auVar72._0_4_ = fVar44;
      auVar72._8_4_ = fVar44;
      auVar72._12_4_ = fVar44;
      fVar2 = *(float *)(lVar26 + -0x20 + lVar27);
      auVar77._4_4_ = fVar2;
      auVar77._0_4_ = fVar2;
      auVar77._8_4_ = fVar2;
      auVar77._12_4_ = fVar2;
      fVar3 = *(float *)(lVar26 + -0x10 + lVar27);
      auVar82._4_4_ = fVar3;
      auVar82._0_4_ = fVar3;
      auVar82._8_4_ = fVar3;
      auVar82._12_4_ = fVar3;
      fVar42 = fVar42 * fVar3;
      auVar63._4_4_ = fVar42;
      auVar63._0_4_ = fVar42;
      auVar63._8_4_ = fVar42;
      auVar63._12_4_ = fVar42;
      auVar70 = vfmsub231ps_fma(auVar63,auVar77,auVar67);
      fVar44 = fVar43 * fVar44;
      auVar38._4_4_ = fVar44;
      auVar38._0_4_ = fVar44;
      auVar38._8_4_ = fVar44;
      auVar38._12_4_ = fVar44;
      auVar71 = vfmsub231ps_fma(auVar38,auVar82,auVar46);
      fVar2 = fVar2 * fVar36;
      auVar47._4_4_ = fVar2;
      auVar47._0_4_ = fVar2;
      auVar47._8_4_ = fVar2;
      auVar47._12_4_ = fVar2;
      auVar38 = vsubps_avx(auVar52,*(undefined1 (*) [16])ray);
      auVar57 = vsubps_avx(auVar60,*(undefined1 (*) [16])(ray + 0x10));
      auVar47 = vfmsub231ps_fma(auVar47,auVar72,auVar69);
      auVar58 = vsubps_avx(auVar65,*(undefined1 (*) [16])(ray + 0x20));
      auVar39 = *(undefined1 (*) [16])(ray + 0x40);
      auVar54 = *(undefined1 (*) [16])(ray + 0x50);
      auVar34 = *(undefined1 (*) [16])(ray + 0x60);
      auVar83._0_4_ = auVar39._0_4_ * auVar57._0_4_;
      auVar83._4_4_ = auVar39._4_4_ * auVar57._4_4_;
      auVar83._8_4_ = auVar39._8_4_ * auVar57._8_4_;
      auVar83._12_4_ = auVar39._12_4_ * auVar57._12_4_;
      auVar52 = vfmsub231ps_fma(auVar83,auVar38,auVar54);
      auVar66._0_4_ = auVar34._0_4_ * auVar47._0_4_;
      auVar66._4_4_ = auVar34._4_4_ * auVar47._4_4_;
      auVar66._8_4_ = auVar34._8_4_ * auVar47._8_4_;
      auVar66._12_4_ = auVar34._12_4_ * auVar47._12_4_;
      auVar62 = vfmadd231ps_fma(auVar66,auVar71,auVar54);
      auVar84._0_4_ = auVar54._0_4_ * auVar58._0_4_;
      auVar84._4_4_ = auVar54._4_4_ * auVar58._4_4_;
      auVar84._8_4_ = auVar54._8_4_ * auVar58._8_4_;
      auVar84._12_4_ = auVar54._12_4_ * auVar58._12_4_;
      auVar60 = vfmsub231ps_fma(auVar84,auVar57,auVar34);
      auVar85._0_4_ = auVar34._0_4_ * auVar38._0_4_;
      auVar85._4_4_ = auVar34._4_4_ * auVar38._4_4_;
      auVar85._8_4_ = auVar34._8_4_ * auVar38._8_4_;
      auVar85._12_4_ = auVar34._12_4_ * auVar38._12_4_;
      auVar63 = vfmsub231ps_fma(auVar85,auVar58,auVar39);
      auVar34 = vfmadd231ps_fma(auVar62,auVar70,auVar39);
      auVar29._0_4_ = fVar3 * auVar52._0_4_;
      auVar29._4_4_ = fVar3 * auVar52._4_4_;
      auVar29._8_4_ = fVar3 * auVar52._8_4_;
      auVar29._12_4_ = fVar3 * auVar52._12_4_;
      auVar54 = vfmadd231ps_fma(auVar29,auVar63,auVar77);
      auVar78._8_4_ = 0x80000000;
      auVar78._0_8_ = 0x8000000080000000;
      auVar78._12_4_ = 0x80000000;
      auVar39 = vandps_avx(auVar78,auVar34);
      auVar54 = vfmadd231ps_fma(auVar54,auVar60,auVar72);
      uVar75 = auVar39._0_4_;
      auVar73._0_4_ = uVar75 ^ auVar54._0_4_;
      uVar79 = auVar39._4_4_;
      auVar73._4_4_ = uVar79 ^ auVar54._4_4_;
      uVar80 = auVar39._8_4_;
      auVar73._8_4_ = uVar80 ^ auVar54._8_4_;
      uVar81 = auVar39._12_4_;
      auVar73._12_4_ = uVar81 ^ auVar54._12_4_;
      auVar39 = vcmpps_avx(auVar73,_DAT_01f45a50,5);
      auVar54 = auVar51 & auVar39;
      if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar54 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar54 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar54[0xf])
      {
LAB_0153ff5e:
        auVar7._8_8_ = uVar15;
        auVar7._0_8_ = uVar14;
      }
      else {
        auVar39 = vandps_avx(auVar39,auVar51);
        auVar31._0_4_ = fVar43 * auVar52._0_4_;
        auVar31._4_4_ = fVar43 * auVar52._4_4_;
        auVar31._8_4_ = fVar43 * auVar52._8_4_;
        auVar31._12_4_ = fVar43 * auVar52._12_4_;
        auVar54 = vfmadd132ps_fma(auVar63,auVar31,auVar69);
        auVar54 = vfmadd132ps_fma(auVar60,auVar54,auVar46);
        auVar56._0_4_ = uVar75 ^ auVar54._0_4_;
        auVar56._4_4_ = uVar79 ^ auVar54._4_4_;
        auVar56._8_4_ = uVar80 ^ auVar54._8_4_;
        auVar56._12_4_ = uVar81 ^ auVar54._12_4_;
        auVar54 = vcmpps_avx(auVar56,_DAT_01f45a50,5);
        auVar62 = auVar39 & auVar54;
        if ((((auVar62 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar62 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar62 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar62[0xf]
           ) goto LAB_0153ff5e;
        auVar62 = vandps_avx(auVar34,local_1978);
        auVar39 = vandps_avx(auVar54,auVar39);
        auVar54 = vsubps_avx(auVar62,auVar73);
        auVar54 = vcmpps_avx(auVar54,auVar56,5);
        auVar52 = auVar39 & auVar54;
        if ((((auVar52 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar52 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar52 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar52[0xf]
           ) goto LAB_0153ff5e;
        auVar39 = vandps_avx(auVar54,auVar39);
        auVar32._0_4_ = auVar58._0_4_ * auVar47._0_4_;
        auVar32._4_4_ = auVar58._4_4_ * auVar47._4_4_;
        auVar32._8_4_ = auVar58._8_4_ * auVar47._8_4_;
        auVar32._12_4_ = auVar58._12_4_ * auVar47._12_4_;
        auVar54 = vfmadd213ps_fma(auVar57,auVar71,auVar32);
        auVar54 = vfmadd213ps_fma(auVar38,auVar70,auVar54);
        auVar61._0_4_ = uVar75 ^ auVar54._0_4_;
        auVar61._4_4_ = uVar79 ^ auVar54._4_4_;
        auVar61._8_4_ = uVar80 ^ auVar54._8_4_;
        auVar61._12_4_ = uVar81 ^ auVar54._12_4_;
        auVar33._0_4_ = auVar62._0_4_ * *(float *)(ray + 0x30);
        auVar33._4_4_ = auVar62._4_4_ * *(float *)(ray + 0x34);
        auVar33._8_4_ = auVar62._8_4_ * *(float *)(ray + 0x38);
        auVar33._12_4_ = auVar62._12_4_ * *(float *)(ray + 0x3c);
        auVar53._0_4_ = auVar62._0_4_ * *(float *)(ray + 0x80);
        auVar53._4_4_ = auVar62._4_4_ * *(float *)(ray + 0x84);
        auVar53._8_4_ = auVar62._8_4_ * *(float *)(ray + 0x88);
        auVar53._12_4_ = auVar62._12_4_ * *(float *)(ray + 0x8c);
        auVar54 = vcmpps_avx(auVar33,auVar61,1);
        auVar38 = vcmpps_avx(auVar61,auVar53,2);
        auVar54 = vandps_avx(auVar38,auVar54);
        auVar38 = auVar39 & auVar54;
        if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar38 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar38 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar38[0xf]
           ) {
LAB_01540474:
          auVar7._8_8_ = uVar15;
          auVar7._0_8_ = uVar14;
        }
        else {
          auVar39 = vandps_avx(auVar39,auVar54);
          auVar54 = vcmpps_avx(auVar34,_DAT_01f45a50,4);
          auVar34 = auVar39 & auVar54;
          if ((((auVar34 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar34 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar34 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar34[0xf]) goto LAB_01540474;
          auVar7 = vandps_avx(auVar54,auVar39);
          local_1968 = auVar47;
          local_1958 = auVar71;
          local_1948 = auVar70;
          local_1938 = auVar62;
          _local_1928 = auVar61;
          _local_1918 = auVar56;
          _local_1908 = auVar73;
        }
      }
      pGVar5 = (context->scene->geometries).items[uVar17].ptr;
      uVar75 = pGVar5->mask;
      auVar30._4_4_ = uVar75;
      auVar30._0_4_ = uVar75;
      auVar30._8_4_ = uVar75;
      auVar30._12_4_ = uVar75;
      auVar39 = vpand_avx(auVar30,*(undefined1 (*) [16])(ray + 0x90));
      auVar39 = vpcmpeqd_avx(auVar39,_DAT_01f45a50);
      auVar54 = auVar7 & ~auVar39;
      auVar74 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar54[0xf] < '\0'
         ) {
        uVar18 = *(undefined4 *)(lVar26 + 0x10 + lVar27);
        auVar39 = vandnps_avx(auVar39,auVar7);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar54 = vrcpps_avx(local_1938);
          auVar48._8_4_ = 0x3f800000;
          auVar48._0_8_ = 0x3f8000003f800000;
          auVar48._12_4_ = 0x3f800000;
          auVar34 = vfnmadd213ps_fma(auVar54,local_1938,auVar48);
          auVar54 = vfmadd132ps_fma(auVar34,auVar54,auVar54);
          fVar36 = auVar54._0_4_;
          fVar42 = auVar54._4_4_;
          fVar43 = auVar54._8_4_;
          fVar44 = auVar54._12_4_;
          local_1748 = fVar36 * (float)local_1908._0_4_;
          fStack_1744 = fVar42 * (float)local_1908._4_4_;
          fStack_1740 = fVar43 * fStack_1900;
          fStack_173c = fVar44 * fStack_18fc;
          local_1798._0_8_ = local_1948._0_8_;
          local_1798._8_8_ = local_1948._8_8_;
          local_1798._16_8_ = local_1958._0_8_;
          local_1798._24_8_ = local_1958._8_8_;
          local_1798._32_8_ = local_1968._0_8_;
          local_1798._40_8_ = local_1968._8_8_;
          local_1768 = CONCAT44(fVar42 * (float)local_1928._4_4_,fVar36 * (float)local_1928._0_4_);
          uStack_1760 = CONCAT44(fVar44 * fStack_191c,fVar43 * fStack_1920);
          local_1758._4_4_ = fVar42 * (float)local_1918._4_4_;
          local_1758._0_4_ = fVar36 * (float)local_1918._0_4_;
          fStack_1750 = fVar43 * fStack_1910;
          fStack_174c = fVar44 * fStack_190c;
          args.valid = (int *)&Ng;
          args.geometryUserPtr = &t;
          args.context = (RTCRayQueryContext *)&v;
          args.ray = (RTCRayN *)&u;
          std::
          _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
          ::
          _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                    ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                      *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                               *)&local_1798.field_0);
          local_1738._4_4_ = uVar17;
          local_1738._0_4_ = uVar17;
          local_1738._8_4_ = uVar17;
          local_1738._12_4_ = uVar17;
          local_1798._0_8_ = Ng.field_0._0_8_;
          local_1798._8_8_ = Ng.field_0._8_8_;
          local_1798._16_8_ = Ng.field_0._16_8_;
          local_1798._24_8_ = Ng.field_0._24_8_;
          local_1798._32_8_ = Ng.field_0._32_8_;
          local_1798._40_8_ = Ng.field_0._40_8_;
          local_1768 = u.field_0._0_8_;
          uStack_1760 = u.field_0._8_8_;
          _local_1758 = v.field_0;
          vpcmpeqd_avx2(ZEXT1632(local_1738),ZEXT1632(local_1738));
          uStack_1724 = context->user->instID[0];
          local_1728 = uStack_1724;
          uStack_1720 = uStack_1724;
          uStack_171c = uStack_1724;
          uStack_1718 = context->user->instPrimID[0];
          uStack_1714 = uStack_1718;
          uStack_1710 = uStack_1718;
          uStack_170c = uStack_1718;
          auVar54 = *(undefined1 (*) [16])(ray + 0x80);
          auVar34 = vblendvps_avx(auVar54,(undefined1  [16])t.field_0,auVar39);
          *(undefined1 (*) [16])(ray + 0x80) = auVar34;
          args.valid = (int *)local_19a8;
          args.geometryUserPtr = pGVar5->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_1798;
          args.N = 4;
          args.ray = (RTCRayN *)ray;
          local_19a8 = auVar39;
          local_1748 = (float)uVar18;
          fStack_1744 = (float)uVar18;
          fStack_1740 = (float)uVar18;
          fStack_173c = (float)uVar18;
          if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar5->occlusionFilterN)(&args);
          }
          if (local_19a8 == (undefined1  [16])0x0) {
            auVar39 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
            auVar39 = auVar39 ^ _DAT_01f46b70;
            auVar74 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          }
          else {
            p_Var6 = context->args->filter;
            if (p_Var6 == (RTCFilterFunctionN)0x0) {
              auVar74 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            }
            else {
              auVar74 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar5->field_8).field_0x2 & 0x40) != 0)) {
                (*p_Var6)(&args);
                auVar74 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              }
            }
            auVar34 = vpcmpeqd_avx(local_19a8,_DAT_01f45a50);
            auVar39 = auVar34 ^ _DAT_01f46b70;
            auVar49._8_4_ = 0xff800000;
            auVar49._0_8_ = 0xff800000ff800000;
            auVar49._12_4_ = 0xff800000;
            auVar34 = vblendvps_avx(auVar49,*(undefined1 (*) [16])(args.ray + 0x80),auVar34);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar34;
          }
          auVar34 = vpslld_avx(auVar39,0x1f);
          auVar39 = vpsrad_avx(auVar34,0x1f);
          auVar54 = vblendvps_avx(auVar54,*(undefined1 (*) [16])pRVar1,auVar34);
          *(undefined1 (*) [16])pRVar1 = auVar54;
        }
        auVar51 = vpandn_avx(auVar39,auVar51);
      }
      lVar27 = lVar27 + 4;
      lVar20 = local_1980;
    } while ((((auVar51 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              (auVar51 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar51 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             auVar51[0xf] < '\0');
    auVar41 = ZEXT1664(local_19c8);
    auVar54 = vandps_avx(auVar51,local_19c8);
    lVar20 = local_1980 + 1;
    lVar26 = lVar26 + 0xb0;
    auVar51 = local_19c8 & auVar51;
    auVar39 = local_19c8;
    local_19c8 = auVar54;
  } while ((((auVar51 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
            (auVar51 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar51 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           auVar51[0xf] < '\0');
  auVar51 = vpcmpeqd_avx(auVar39,auVar39);
  auVar35._0_4_ = local_19c8._0_4_ ^ auVar51._0_4_;
  auVar35._4_4_ = local_19c8._4_4_ ^ auVar51._4_4_;
  auVar35._8_4_ = local_19c8._8_4_ ^ auVar51._8_4_;
  auVar35._12_4_ = local_19c8._12_4_ ^ auVar51._12_4_;
  auVar10._4_4_ = iStack_18e4;
  auVar10._0_4_ = local_18e8;
  auVar10._8_4_ = iStack_18e0;
  auVar10._12_4_ = iStack_18dc;
  terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)vorps_avx(auVar35,auVar10);
  auVar51 = auVar51 & ~(undefined1  [16])terminated.field_0;
  if ((((auVar51 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar51 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar51 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar51[0xf])
  goto LAB_015405d5;
  auVar41 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
  auVar50._8_4_ = 0xff800000;
  auVar50._0_8_ = 0xff800000ff800000;
  auVar50._12_4_ = 0xff800000;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar50,
                     (undefined1  [16])terminated.field_0);
  goto LAB_0153fbe1;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }